

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_average_face_to_cellcenter(MultiFab *ccmf,int dcomp,Array<const_MultiFab_*,_3> *fmf)

{
  int iVar1;
  int iVar2;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var3;
  EBCellFlagFab *this;
  int iVar4;
  int iVar5;
  int iVar6;
  Array<const_MultiFab_*,_3> *pAVar7;
  FabType FVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint32_t *puVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  void *__s;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  double dVar40;
  MFIter mfi;
  MFItInfo info;
  long local_3a8;
  long local_380;
  Box local_35c;
  long local_340;
  FabArray<amrex::FArrayBox> *local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  ulong local_310;
  long local_308;
  int local_300;
  int local_2fc;
  Array<const_MultiFab_*,_3> *local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  Array4<double> local_2d8;
  FabArray<amrex::EBCellFlagFab> *local_298;
  long local_290;
  long local_288;
  ulong local_280;
  long local_278;
  uint32_t *local_270;
  long local_268;
  long local_260;
  ulong local_258;
  double *local_250;
  long local_248;
  Array4<const_double> local_240;
  Array4<const_double> local_200;
  Array4<const_double> local_1c0;
  MultiCutFab *local_180;
  MultiCutFab *local_178;
  MultiCutFab *local_170;
  Array4<const_double> local_168;
  Array4<const_double> local_128;
  Array4<const_double> local_e8;
  MFIter local_a8;
  MFItInfo local_44;
  
  _Var3._M_head_impl =
       (fmf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_338 = &ccmf->super_FabArray<amrex::FArrayBox>;
  local_2f8 = fmf;
  if ((_Var3._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) &&
     (lVar10 = __dynamic_cast(_Var3._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo), lVar10 != 0)) {
    lVar10 = __dynamic_cast(_Var3._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar10 == 0) {
      __cxa_bad_cast();
    }
    local_298 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar10 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar10 + 0xd8));
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.do_tiling = true;
    local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_44.tilesize.vect[2] = DAT_0083cec0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    MFIter::MFIter(&local_a8,&local_338->super_FabArrayBase,&local_44);
    if (local_a8.currentIndex < local_a8.endIndex) {
      local_260 = (long)dcomp;
      local_268 = (long)(dcomp + 1);
      local_330 = local_260 * 8;
      local_2f0 = local_268 * 8;
      local_2e8 = (long)(dcomp + 2) << 3;
      do {
        MFIter::tilebox(&local_35c,&local_a8);
        piVar11 = &local_a8.currentIndex;
        if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar11 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_a8.currentIndex;
        }
        this = (local_298->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar11];
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2d8,local_338,&local_a8);
        pAVar7 = local_2f8;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1c0,&local_2f8->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_a8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_200,&pAVar7->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_a8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_240,&pAVar7->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_a8);
        FVar8 = EBCellFlagFab::getType(this,&local_35c);
        iVar6 = local_35c.bigend.vect[2];
        iVar5 = local_35c.bigend.vect[1];
        iVar25 = local_35c.bigend.vect[0];
        iVar2 = local_35c.smallend.vect[1];
        iVar1 = local_35c.smallend.vect[0];
        if (FVar8 == regular) {
          local_308 = CONCAT44(local_308._4_4_,local_35c.bigend.vect[2]);
          if (local_35c.smallend.vect[2] <= local_35c.bigend.vect[2]) {
            local_310 = (ulong)(uint)local_35c.bigend.vect[1];
            lVar33 = (long)local_35c.smallend.vect[1];
            lVar10 = (long)local_35c.smallend.vect[0] * 8;
            iVar1 = local_35c.smallend.vect[2];
            iVar2 = local_35c.smallend.vect[2];
            do {
              iVar2 = iVar2 + 1;
              if (local_35c.smallend.vect[1] <= local_35c.bigend.vect[1]) {
                lVar20 = (long)iVar1;
                lVar18 = (long)local_2d8.begin.x;
                local_320 = (long)local_200.begin.y;
                local_318 = (long)local_240.begin.y;
                lVar13 = (long)local_1c0.p +
                         (lVar33 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                         (lVar20 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                         (long)local_1c0.begin.x * -8 + lVar10 + 8;
                lVar19 = local_2d8.jstride * 8;
                lVar26 = (lVar33 - local_2d8.begin.y) * lVar19 +
                         (lVar20 - local_2d8.begin.z) * local_2d8.kstride * 8;
                local_328 = (long)local_240.begin.z;
                lVar30 = (long)local_2d8.p +
                         local_330 * local_2d8.nstride + lVar26 + lVar18 * -8 + lVar10;
                lVar15 = (long)local_2d8.p +
                         local_2f0 * local_2d8.nstride + lVar26 + lVar18 * -8 + lVar10;
                lVar12 = (long)local_2d8.p +
                         local_2d8.nstride * local_2e8 + lVar26 + lVar18 * -8 + lVar10;
                lVar16 = local_200.jstride * 8;
                lVar22 = (lVar20 - local_200.begin.z) * local_200.kstride;
                lVar18 = (long)local_200.p +
                         (lVar33 - local_320) * lVar16 + lVar22 * 8 + (long)local_200.begin.x * -8 +
                         lVar10;
                iVar25 = (local_35c.smallend.vect[1] + 1) - local_200.begin.y;
                lVar14 = local_240.jstride * 8;
                lVar26 = (lVar33 - local_318) * lVar14;
                lVar23 = (long)local_240.p +
                         (long)(iVar2 - local_240.begin.z) * local_240.kstride * 8 + lVar26 +
                         (long)local_240.begin.x * -8 + lVar10;
                lVar20 = (long)local_240.p +
                         (lVar20 - local_328) * local_240.kstride * 8 + lVar26 +
                         (long)local_240.begin.x * -8 + lVar10;
                lVar26 = lVar33;
                do {
                  if (local_35c.smallend.vect[0] <= local_35c.bigend.vect[0]) {
                    lVar21 = 0;
                    do {
                      *(double *)(lVar30 + lVar21 * 8) =
                           (*(double *)(lVar13 + -8 + lVar21 * 8) + *(double *)(lVar13 + lVar21 * 8)
                           ) * 0.5;
                      *(double *)(lVar15 + lVar21 * 8) =
                           (*(double *)(lVar18 + lVar21 * 8) +
                           *(double *)
                            ((long)local_200.p +
                            lVar21 * 8 +
                            iVar25 * lVar16 + lVar22 * 8 + (long)local_200.begin.x * -8 + lVar10)) *
                           0.5;
                      *(double *)(lVar12 + lVar21 * 8) =
                           (*(double *)(lVar20 + lVar21 * 8) + *(double *)(lVar23 + lVar21 * 8)) *
                           0.5;
                      lVar21 = lVar21 + 1;
                    } while ((local_35c.bigend.vect[0] - local_35c.smallend.vect[0]) + 1 !=
                             (int)lVar21);
                  }
                  lVar26 = lVar26 + 1;
                  lVar13 = lVar13 + local_1c0.jstride * 8;
                  lVar30 = lVar30 + lVar19;
                  lVar15 = lVar15 + lVar19;
                  lVar12 = lVar12 + lVar19;
                  lVar18 = lVar18 + lVar16;
                  iVar25 = iVar25 + 1;
                  lVar23 = lVar23 + lVar14;
                  lVar20 = lVar20 + lVar14;
                } while (local_35c.bigend.vect[1] + 1U != (int)lVar26);
              }
              bVar39 = iVar1 != local_35c.bigend.vect[2];
              iVar1 = iVar1 + 1;
            } while (bVar39);
          }
        }
        else if (FVar8 == covered) {
          if (local_35c.smallend.vect[2] <= local_35c.bigend.vect[2]) {
            lVar10 = (long)local_35c.smallend.vect[1];
            lVar33 = (long)local_35c.smallend.vect[0];
            uVar9 = local_35c.bigend.vect[0] - local_35c.smallend.vect[0];
            iVar17 = local_35c.bigend.vect[1] - local_35c.smallend.vect[1];
            iVar4 = local_35c.smallend.vect[2];
            do {
              if (iVar2 <= iVar5) {
                lVar26 = local_2d8.jstride * 8;
                __s = (void *)((long)local_2d8.p +
                              local_2d8.nstride * local_330 + (lVar10 - local_2d8.begin.y) * lVar26
                              + (iVar4 - local_2d8.begin.z) * local_2d8.kstride * 8 +
                              (long)local_2d8.begin.x * -8 + lVar33 * 8);
                iVar35 = iVar17 + 1;
                do {
                  if (iVar1 <= iVar25) {
                    memset(__s,0,(ulong)uVar9 * 8 + 8);
                  }
                  __s = (void *)((long)__s + lVar26);
                  iVar35 = iVar35 + -1;
                } while (iVar35 != 0);
              }
              bVar39 = iVar4 != iVar6;
              iVar4 = iVar4 + 1;
            } while (bVar39);
          }
        }
        else {
          MultiCutFab::const_array(&local_e8,local_180,&local_a8);
          MultiCutFab::const_array(&local_128,local_178,&local_a8);
          MultiCutFab::const_array(&local_168,local_170,&local_a8);
          local_340 = (long)local_35c.smallend.vect[2];
          if (local_35c.smallend.vect[2] <= local_35c.bigend.vect[2]) {
            iVar1 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
            iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
            lVar10 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar1)
                           + 1);
            lVar33 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar2)
                           + 1);
            local_280 = (ulong)(uint)local_35c.bigend.vect[1];
            local_288 = (long)local_35c.smallend.vect[1];
            local_248 = (long)local_35c.smallend.vect[0];
            local_2fc = local_35c.bigend.vect[1] + 1;
            local_300 = local_35c.smallend.vect[0] + 1;
            lVar30 = local_248 * 8;
            lVar26 = lVar33 * lVar10;
            local_278 = lVar26 * 4;
            local_328 = lVar10 * 4;
            local_290 = local_288 + 1;
            local_2e0 = local_340 + 1;
            uVar9 = (local_35c.bigend.vect[0] - local_35c.smallend.vect[0]) + 1;
            local_258 = (ulong)uVar9;
            puVar28 = (uint32_t *)
                      ((long)&(this->super_BaseFab<amrex::EBCellFlag>).dptr[local_248 - iVar1].flag
                      + (local_288 * 4 +
                         (local_340 -
                         (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2]) * lVar33
                         * 4 + (long)iVar2 * -4) * lVar10);
            do {
              local_270 = puVar28;
              puVar28 = local_270;
              local_3a8 = local_288;
              local_380 = local_290;
              if (local_35c.smallend.vect[1] <= local_35c.bigend.vect[1]) {
                do {
                  if (local_35c.smallend.vect[0] <= local_35c.bigend.vect[0]) {
                    lVar19 = (long)local_1c0.begin.x;
                    lVar29 = (local_3a8 - local_2d8.begin.y) * local_2d8.jstride;
                    lVar34 = (local_340 - local_2d8.begin.z) * local_2d8.kstride;
                    local_250 = local_2d8.p;
                    lVar27 = (local_3a8 - local_1c0.begin.y) * local_1c0.jstride;
                    lVar36 = (local_340 - local_1c0.begin.z) * local_1c0.kstride;
                    lVar37 = (local_340 - local_e8.begin.z) * local_e8.kstride;
                    lVar32 = (local_3a8 - local_e8.begin.y) * local_e8.jstride;
                    lVar12 = (local_340 - local_128.begin.z) * local_128.kstride;
                    local_308 = (long)local_128.p +
                                (local_380 - local_128.begin.y) * local_128.jstride * 8 + lVar12 * 8
                                + (long)local_128.begin.x * -8 + lVar30;
                    lVar20 = (local_3a8 - local_168.begin.y) * local_168.jstride;
                    local_310 = (long)local_168.p +
                                (local_2e0 - local_168.begin.z) * local_168.kstride * 8 + lVar20 * 8
                                + (long)local_168.begin.x * -8 + lVar30;
                    lVar33 = lVar29 * 8 + lVar34 * 8;
                    lVar13 = local_240.kstride * 8;
                    lVar21 = (local_3a8 - local_240.begin.y) * local_240.jstride;
                    lVar14 = (long)local_240.begin.x;
                    local_318 = (long)local_240.p +
                                (local_2e0 - local_240.begin.z) * lVar13 + lVar21 * 8 + lVar14 * -8
                                + lVar30;
                    lVar18 = (local_340 - local_240.begin.z) * lVar13 + lVar21 * 8 + lVar14 * -8 +
                             lVar30;
                    lVar15 = local_200.jstride * 8;
                    lVar31 = (local_340 - local_200.begin.z) * local_200.kstride;
                    lVar16 = (long)local_200.begin.x;
                    lVar22 = (local_3a8 - local_200.begin.y) * lVar15 + lVar31 * 8 + lVar16 * -8 +
                             lVar30;
                    local_320 = (long)local_200.p +
                                (local_380 - local_200.begin.y) * lVar15 + lVar31 * 8 + lVar16 * -8
                                + lVar30;
                    lVar24 = (long)local_2d8.begin.x;
                    lVar23 = local_2e8 * local_2d8.nstride + lVar33 + lVar24 * -8 + lVar30;
                    lVar38 = 0;
                    do {
                      if ((~puVar28[lVar38] & 3) == 0) {
                        *(undefined8 *)
                         ((long)local_2d8.p +
                         lVar38 * 8 + local_330 * local_2d8.nstride + lVar33 + lVar24 * -8 + lVar30)
                             = 0;
                        *(undefined8 *)
                         ((long)local_2d8.p +
                         lVar38 * 8 + local_2d8.nstride * local_2f0 + lVar33 + lVar24 * -8 + lVar30)
                             = 0;
                        *(undefined8 *)((long)local_2d8.p + lVar38 * 8 + lVar23) = 0;
                      }
                      else {
                        if ((local_e8.p
                             [local_248 + ((lVar37 + lVar32 + lVar38) - (long)local_e8.begin.x)] !=
                             0.0) || (NAN(local_e8.p
                                          [local_248 +
                                           ((lVar37 + lVar32 + lVar38) - (long)local_e8.begin.x)])))
                        {
                          if ((local_e8.p
                               [local_248 +
                                ((lVar37 + lVar32 + lVar38 + 1) - (long)local_e8.begin.x)] != 0.0)
                             || (NAN(local_e8.p
                                     [local_248 +
                                      ((lVar37 + lVar32 + lVar38 + 1) - (long)local_e8.begin.x)])))
                          {
                            dVar40 = (local_1c0.p[local_248 + ((lVar36 + lVar27 + lVar38) - lVar19)]
                                     + local_1c0.p
                                       [local_248 + ((lVar36 + lVar27 + lVar38 + 1) - lVar19)]) *
                                     0.5;
                          }
                          else {
                            dVar40 = local_1c0.p[local_248 + ((lVar36 + lVar27 + lVar38) - lVar19)];
                          }
                        }
                        else {
                          dVar40 = local_1c0.p
                                   [lVar27 + lVar36 + ((local_300 - local_1c0.begin.x) + (int)lVar38
                                                      )];
                        }
                        local_2d8.p
                        [lVar29 + lVar34 + local_2d8.nstride * local_260 +
                                           ((local_248 + lVar38) - (long)local_2d8.begin.x)] =
                             dVar40;
                        dVar40 = *(double *)
                                  ((long)local_128.p +
                                  lVar38 * 8 +
                                  (local_3a8 - local_128.begin.y) * local_128.jstride * 8 +
                                  lVar12 * 8 + (long)local_128.begin.x * -8 + lVar30);
                        if ((dVar40 != 0.0) || (NAN(dVar40))) {
                          dVar40 = *(double *)(local_308 + lVar38 * 8);
                          if ((dVar40 != 0.0) || (NAN(dVar40))) {
                            dVar40 = (*(double *)((long)local_200.p + lVar38 * 8 + lVar22) +
                                     *(double *)(local_320 + lVar38 * 8)) * 0.5;
                          }
                          else {
                            dVar40 = *(double *)((long)local_200.p + lVar38 * 8 + lVar22);
                          }
                        }
                        else {
                          dVar40 = *(double *)
                                    ((long)local_200.p +
                                    lVar38 * 8 +
                                    ((int)local_380 - local_200.begin.y) * lVar15 + lVar31 * 8 +
                                    lVar16 * -8 + lVar30);
                        }
                        local_2d8.p
                        [lVar29 + lVar34 + local_2d8.nstride * local_268 +
                                           ((local_248 + lVar38) - (long)local_2d8.begin.x)] =
                             dVar40;
                        dVar40 = *(double *)
                                  ((long)local_168.p +
                                  lVar38 * 8 +
                                  (local_340 - local_168.begin.z) * local_168.kstride * 8 +
                                  lVar20 * 8 + (long)local_168.begin.x * -8 + lVar30);
                        if ((dVar40 != 0.0) || (NAN(dVar40))) {
                          dVar40 = *(double *)(local_310 + lVar38 * 8);
                          if ((dVar40 != 0.0) || (NAN(dVar40))) {
                            dVar40 = (*(double *)((long)local_240.p + lVar38 * 8 + lVar18) +
                                     *(double *)(local_318 + lVar38 * 8)) * 0.5;
                          }
                          else {
                            dVar40 = *(double *)((long)local_240.p + lVar38 * 8 + lVar18);
                          }
                        }
                        else {
                          dVar40 = *(double *)
                                    ((long)local_240.p +
                                    lVar38 * 8 +
                                    ((int)local_2e0 - local_240.begin.z) * lVar13 + lVar21 * 8 +
                                    lVar14 * -8 + lVar30);
                        }
                        *(double *)((long)local_2d8.p + lVar38 * 8 + lVar23) = dVar40;
                      }
                      lVar38 = lVar38 + 1;
                    } while (uVar9 != (uint)lVar38);
                  }
                  local_3a8 = local_3a8 + 1;
                  puVar28 = puVar28 + lVar10;
                  local_380 = local_380 + 1;
                } while (local_2fc != (int)local_3a8);
              }
              local_340 = local_340 + 1;
              local_2e0 = local_2e0 + 1;
              puVar28 = local_270 + lVar26;
            } while (local_35c.bigend.vect[2] + 1 != (int)local_340);
          }
        }
        MFIter::operator++(&local_a8);
      } while (local_a8.currentIndex < local_a8.endIndex);
    }
    MFIter::~MFIter(&local_a8);
    return;
  }
  average_face_to_cellcenter((MultiFab *)local_338,dcomp,local_2f8,0);
  return;
}

Assistant:

void
EB_average_face_to_cellcenter (MultiFab& ccmf, int dcomp,
                               const Array<MultiFab const*,AMREX_SPACEDIM>& fmf)
{
    AMREX_ASSERT(ccmf.nComp() >= dcomp + AMREX_SPACEDIM);

    if (!fmf[0]->hasEBFabFactory())
    {
        average_face_to_cellcenter(ccmf, dcomp, fmf);
    }
    else
    {
        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fmf[0]->Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& area = factory.getAreaFrac();

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(ccmf,info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& flagfab = flags[mfi];
            Array4<Real> const& ccfab = ccmf.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& xfab = fmf[0]->const_array(mfi);,
                         Array4<Real const> const& yfab = fmf[1]->const_array(mfi);,
                         Array4<Real const> const& zfab = fmf[2]->const_array(mfi));
            const auto fabtyp = flagfab.getType(bx);
            if (fabtyp == FabType::covered) {
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    ccfab(i,j,k,dcomp) = 0.0;
                });
            } else if (fabtyp == FabType::regular) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k,ccfab,AMREX_D_DECL(xfab,yfab,zfab),dcomp);
                });
            } else {
                AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                             Array4<Real const> const& apy = area[1]->const_array(mfi);,
                             Array4<Real const> const& apz = area[2]->const_array(mfi));
                Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
                AMREX_HOST_DEVICE_FOR_3D(bx,i,j,k,
                {
                    eb_avg_fc_to_cc(i,j,k,dcomp,ccfab,AMREX_D_DECL(xfab,yfab,zfab),
                                    AMREX_D_DECL(apx,apy,apz),flagarr);
                });
            }
        }
    }
}